

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O1

pair<const_void_*,_int> __thiscall
google::protobuf::SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::
FindExtension(DescriptorIndex<std::pair<const_void_*,_int>_> *this,string *containing_type,
             int field_number)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  undefined4 uVar4;
  _Base_ptr p_Var5;
  pair<const_void_*,_int> pVar6;
  key_type local_50;
  
  paVar1 = &local_50.first.field_2;
  pcVar2 = (containing_type->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + containing_type->_M_string_length);
  local_50.second = field_number;
  cVar3 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>,_std::_Select1st<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::pair<const_void_*,_int>_>_>_>
          ::find(&(this->by_extension_)._M_t,&local_50);
  uVar4 = 0;
  if ((_Rb_tree_header *)cVar3._M_node == &(this->by_extension_)._M_t._M_impl.super__Rb_tree_header)
  {
    p_Var5 = (_Base_ptr)0x0;
  }
  else {
    p_Var5 = cVar3._M_node[2]._M_parent;
    uVar4 = *(undefined4 *)&cVar3._M_node[2]._M_left;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  pVar6.second = uVar4;
  pVar6.first = p_Var5;
  pVar6._12_4_ = 0;
  return pVar6;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindExtension(
    const string& containing_type,
    int field_number) {
  return FindWithDefault(
      by_extension_, std::make_pair(containing_type, field_number), Value());
}